

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O3

ValueHolder * __thiscall
testing::internal::
CheckedDowncastToActualType<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
          (internal *this,ThreadLocalValueHolderBase *base)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s1;
  iterator __position;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  ValueHolder *pVVar5;
  long lVar6;
  GTestLog local_14;
  
  if (this == (internal *)0x0) {
    __cxa_bad_typeid();
    __position._M_current =
         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this + 8);
    if (__position._M_current ==
        *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
         ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this + 0x10)) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_realloc_insert<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                 __position,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)base);
      lVar6 = *(long *)((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this +
                       8);
    }
    else {
      ((__position._M_current)->_M_dataplus)._M_p = (pointer)&(__position._M_current)->field_2;
      pcVar2 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)base)->
               _M_dataplus)._M_p;
      paVar1 = &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)base)->field_2
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 == paVar1) {
        uVar3 = *(undefined8 *)
                 ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)base)
                         ->field_2 + 8);
        ((__position._M_current)->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
        *(undefined8 *)((long)&(__position._M_current)->field_2 + 8) = uVar3;
      }
      else {
        ((__position._M_current)->_M_dataplus)._M_p = pcVar2;
        ((__position._M_current)->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      (__position._M_current)->_M_string_length =
           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)base)->
           _M_string_length;
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)base)->_M_dataplus).
      _M_p = (pointer)paVar1;
      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)base)->_M_string_length
           = 0;
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)base)->field_2).
      _M_local_buf[0] = '\0';
      lVar6 = *(long *)((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this +
                       8) + 0x20;
      *(long *)((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this + 8) =
           lVar6;
    }
    return (ValueHolder *)(lVar6 + -0x20);
  }
  __s1 = *(char **)(*(long *)(*(long *)this + -8) + 8);
  if (__s1 != 
      "N7testing8internal11ThreadLocalIPNS_31TestPartResultReporterInterfaceEE11ValueHolderE") {
    if (*__s1 != '*') {
      iVar4 = strcmp(__s1,
                     "N7testing8internal11ThreadLocalIPNS_31TestPartResultReporterInterfaceEE11ValueHolderE"
                    );
      if (iVar4 == 0) goto LAB_00179046;
    }
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/gtest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x44d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ",0x33);
    GTestLog::~GTestLog(&local_14);
  }
LAB_00179046:
  pVVar5 = (ValueHolder *)
           __dynamic_cast(this,&ThreadLocalValueHolderBase::typeinfo,
                          &ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder::
                           typeinfo,0);
  return pVVar5;
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}